

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall soul::AST::ComplexMemberRef::~ComplexMemberRef(ComplexMemberRef *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ComplexMemberRef_002f8520;
  pcVar2 = (this->memberName)._M_dataplus._M_p;
  paVar1 = &(this->memberName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  RefCountedPtr<soul::Structure>::decIfNotNull((this->memberType).structure.object);
  RefCountedPtr<soul::Structure>::decIfNotNull((this->complexType).structure.object);
  ASTObject::~ASTObject((ASTObject *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

ComplexMemberRef (const Context& c, Expression& o, Type t, std::string member)
            : Expression (ObjectType::ComplexMemberRef, c, ExpressionKind::value),
              object (o), complexType (t), memberName (std::move (member))
        {
            SOUL_ASSERT (t.isComplex());
            SOUL_ASSERT (isPossiblyValue (object.get()));

            if (complexType.isVector())
                memberType = Type::createVector (complexType.getElementType().isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64, complexType.getVectorSize());
            else
                memberType = complexType.isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64;
        }